

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O2

void __thiscall front::syntax::SyntaxAnalyze::gm_const_def(SyntaxAnalyze *this)

{
  long lVar1;
  pointer psVar2;
  pointer psVar3;
  bool bVar4;
  bool bVar5;
  ArraySymbol *this_00;
  IntSymbol *this_01;
  __shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *p_Var6;
  string *name_00;
  SharedSyPtr symbol;
  shared_ptr<front::symbol::Symbol> local_1c8;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  init_values;
  shared_ptr<front::express::ExpressNode> i;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  dimensions;
  vector<unsigned_int,_std::allocator<unsigned_int>_> inits;
  SharedExNdPtr dimension;
  SharedSyPtr local_128;
  string name;
  __shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2> local_f8;
  __shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> local_d8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_c8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  symbol.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  symbol.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dimension.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  dimension.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  init_values.
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  init_values.
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  init_values.
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dimensions.
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  dimensions.
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  dimensions.
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  inits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  inits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  inits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  match_one_word(this,IDENFR);
  word::Word::get_self_abi_cxx11_
            ((string *)&i,
             (this->word_list->
             super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
             super__Vector_impl_data._M_start + this->matched_index);
  std::__cxx11::string::operator=((string *)&name,(string *)&i);
  std::__cxx11::string::~string((string *)&i);
  bVar4 = try_word(this,1,LBRACK);
  if (bVar4) {
    while( true ) {
      bVar5 = try_word(this,1,LBRACK);
      if (!bVar5) break;
      match_one_word(this,LBRACK);
      gm_exp((SyntaxAnalyze *)&i);
      std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&dimension.
                  super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)&i);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&i.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      match_one_word(this,RBRACK);
      std::
      vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
      ::push_back(&dimensions,
                  (value_type *)
                  &dimension.
                   super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>);
    }
  }
  match_one_word(this,ASSIGN);
  bVar5 = try_word(this,1,LBRACE);
  if (bVar5) {
    match_one_word(this,LBRACE);
    gm_const_init_val(this,&init_values,&dimensions,0);
    match_one_word(this,RBRACE);
  }
  else {
    gm_const_init_val(this,&init_values,&dimensions,0);
  }
  psVar2 = init_values.
           super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (init_values.
      super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      init_values.
      super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    for (p_Var6 = &(init_values.
                    super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                   super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>;
        p_Var6 != &psVar2->
                   super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>;
        p_Var6 = p_Var6 + 1) {
      std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&i.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>,
                 p_Var6);
      local_1c8.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
           (i.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           _value;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&inits,(uint *)&local_1c8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&i.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
  }
  if (bVar4) {
    this_00 = (ArraySymbol *)operator_new(0x78);
    std::__cxx11::string::string((string *)&local_b0,(string *)&name);
    front::symbol::IntSymbol::getHolderIntSymbol();
    front::symbol::ArraySymbol::ArraySymbol(this_00,&local_b0,&local_128,this->layer_num,true,false)
    ;
    std::__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>::
    reset<front::symbol::ArraySymbol>
              (&symbol.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>,this_00
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_128.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)&local_b0);
    psVar2 = dimensions.
             super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (p_Var6 = &(dimensions.
                    super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                   super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>;
        psVar3 = init_values.
                 super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
        p_Var6 != &psVar2->
                   super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>;
        p_Var6 = p_Var6 + 1) {
      std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&i.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>,
                 p_Var6);
      std::static_pointer_cast<front::symbol::ArraySymbol,front::symbol::Symbol>(&local_1c8);
      lVar1 = CONCAT44(local_1c8.
                       super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                       _4_4_,(int)local_1c8.
                                  super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
      std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_d8,
                 &i.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>);
      std::
      vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
      ::push_back((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                   *)(lVar1 + 0x48),(value_type *)&local_d8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_1c8.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&i.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    for (p_Var6 = &(init_values.
                    super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                   super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>;
        p_Var6 != &psVar3->
                   super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>;
        p_Var6 = p_Var6 + 1) {
      std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&i.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>,
                 p_Var6);
      std::static_pointer_cast<front::symbol::ArraySymbol,front::symbol::Symbol>(&local_1c8);
      lVar1 = CONCAT44(local_1c8.
                       super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                       _4_4_,(int)local_1c8.
                                  super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
      std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_e8,
                 &i.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>);
      std::
      vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
      ::push_back((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                   *)(lVar1 + 0x60),(value_type *)&local_e8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_1c8.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&i.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    std::__cxx11::string::string((string *)&local_70,(string *)&name);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_c8,&inits);
    name_00 = &local_70;
    irGenerator::irGenerator::ir_declare_const
              (&this->irGenerator,name_00,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_c8,
               (symbol.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->id);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_c8);
  }
  else {
    this_01 = (IntSymbol *)operator_new(0x40);
    std::__cxx11::string::string((string *)&local_90,(string *)&name);
    front::symbol::IntSymbol::IntSymbol
              (this_01,&local_90,this->layer_num,true,
               (((init_values.
                  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
               ->_value);
    std::__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>::
    reset<front::symbol::IntSymbol>
              (&symbol.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>,this_01
              );
    std::__cxx11::string::~string((string *)&local_90);
    name_00 = &local_50;
    std::__cxx11::string::string((string *)name_00,(string *)&name);
    irGenerator::irGenerator::ir_declare_const
              (&this->irGenerator,name_00,
               *inits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start,
               (symbol.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->id);
  }
  std::__cxx11::string::~string((string *)name_00);
  std::__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_f8,&symbol.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>
            );
  symbolTable::SymbolTable::push_symbol(&this->symbolTable,(SharedSyPtr *)&local_f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f8._M_refcount);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&inits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ::~vector(&dimensions);
  std::
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ::~vector(&init_values);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&dimension.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&symbol.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void SyntaxAnalyze::gm_const_def() {
  string name;
  SymbolKind kind;
  SharedSyPtr symbol;
  SharedExNdPtr dimension;
  vector<SharedExNdPtr> init_values;
  vector<SharedExNdPtr> dimensions;
  vector<std::uint32_t> inits;

  match_one_word(Token::IDENFR);
  name = get_least_matched_word().get_self();

  if (try_word(1, Token::LBRACK)) {
    kind = SymbolKind::Array;
    while (try_word(1, Token::LBRACK)) {
      match_one_word(Token::LBRACK);
      dimension = gm_const_exp();
      match_one_word(Token::RBRACK);

      dimensions.push_back(dimension);
    }
  } else {
    kind = SymbolKind::INT;
  }

  match_one_word(Token::ASSIGN);

  if (try_word(1, Token::LBRACE)) {
    match_one_word(Token::LBRACE);
    gm_const_init_val(init_values, dimensions, 0);
    match_one_word(Token::RBRACE);
  } else {
    gm_const_init_val(init_values, dimensions, 0);
  }

  if (init_values.size() > 0) {
    for (auto i : init_values) {
      inits.push_back(i->_value);
    }
  }

  if (kind == SymbolKind::INT) {
    symbol.reset(
        new IntSymbol(name, layer_num, true, init_values.front()->_value));
    irGenerator.ir_declare_const(name, inits.front(), symbol->getId());
  } else {
    symbol.reset(new ArraySymbol(name, IntSymbol::getHolderIntSymbol(),
                                 layer_num, true, false));
    for (auto var : dimensions) {
      std::static_pointer_cast<ArraySymbol>(symbol)->addDimension(var);
    }
    for (auto value : init_values) {
      std::static_pointer_cast<ArraySymbol>(symbol)->addValue(value);
    }

    irGenerator.ir_declare_const(name, inits, symbol->getId());
  }

  symbolTable.push_symbol(symbol);
}